

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Type TVar4;
  uint32 v;
  protobuf *this_00;
  uint64 v_00;
  string *data;
  ulong uVar5;
  UnknownFieldSet *unknown_fields_00;
  uint *dest;
  int i_00;
  unsigned_long i_01;
  Hex hex;
  Hex hex_00;
  StringPiece src;
  StringPiece local_188;
  allocator local_171;
  undefined1 local_170 [8];
  string printed;
  UnknownFieldSet embedded_unknown_fields;
  string *value;
  undefined4 local_138;
  AlphaNum local_130;
  string local_100;
  undefined1 local_e0 [12];
  AlphaNum local_d0;
  string local_a0;
  string local_80;
  undefined1 local_50 [8];
  string field_number;
  UnknownField *field;
  int i;
  TextGenerator *generator_local;
  UnknownFieldSet *unknown_fields_local;
  Printer *this_local;
  AlphaNum *a;
  AlphaNum *a_00;
  
  for (field._4_4_ = 0; iVar2 = UnknownFieldSet::field_count(unknown_fields), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    field_number.field_2._8_8_ = UnknownFieldSet::field(unknown_fields,field._4_4_);
    uVar3 = UnknownField::number((UnknownField *)field_number.field_2._8_8_);
    SimpleItoa_abi_cxx11_((string *)local_50,(protobuf *)(ulong)uVar3,i_00);
    TVar4 = UnknownField::type((UnknownField *)field_number.field_2._8_8_);
    dest = &switchD_00b3e4fd::switchdataD_00bc8ab0;
    switch(TVar4) {
    case TYPE_VARINT:
      TextGenerator::Print(generator,(string *)local_50);
      TextGenerator::Print(generator,": ");
      this_00 = (protobuf *)UnknownField::varint((UnknownField *)field_number.field_2._8_8_);
      SimpleItoa_abi_cxx11_(&local_80,this_00,i_01);
      TextGenerator::Print(generator,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if ((this->single_line_mode_ & 1U) == 0) {
        TextGenerator::Print(generator,"\n");
      }
      else {
        TextGenerator::Print(generator," ");
      }
      break;
    case TYPE_FIXED32:
      TextGenerator::Print(generator,(string *)local_50);
      TextGenerator::Print(generator,": 0x");
      v = UnknownField::fixed32((UnknownField *)field_number.field_2._8_8_);
      strings::Hex::Hex<unsigned_int>((Hex *)local_e0,v,ZERO_PAD_8);
      hex._12_4_ = 0;
      hex.value = local_e0._0_8_;
      hex.spec = local_e0._8_4_;
      strings::AlphaNum::AlphaNum(&local_d0,hex);
      StrCat_abi_cxx11_(&local_a0,(protobuf *)&local_d0,a);
      TextGenerator::Print(generator,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if ((this->single_line_mode_ & 1U) == 0) {
        TextGenerator::Print(generator,"\n");
      }
      else {
        TextGenerator::Print(generator," ");
      }
      break;
    case TYPE_FIXED64:
      TextGenerator::Print(generator,(string *)local_50);
      TextGenerator::Print(generator,": 0x");
      v_00 = UnknownField::fixed64((UnknownField *)field_number.field_2._8_8_);
      strings::Hex::Hex<unsigned_long>((Hex *)&value,v_00,ZERO_PAD_16);
      hex_00._12_4_ = 0;
      hex_00.value = (uint64)value;
      hex_00.spec = local_138;
      strings::AlphaNum::AlphaNum(&local_130,hex_00);
      StrCat_abi_cxx11_(&local_100,(protobuf *)&local_130,a_00);
      TextGenerator::Print(generator,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      if ((this->single_line_mode_ & 1U) == 0) {
        TextGenerator::Print(generator,"\n");
      }
      else {
        TextGenerator::Print(generator," ");
      }
      break;
    case TYPE_LENGTH_DELIMITED:
      TextGenerator::Print(generator,(string *)local_50);
      data = UnknownField::length_delimited_abi_cxx11_((UnknownField *)field_number.field_2._8_8_);
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)((long)&printed.field_2 + 8));
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) &&
         (bVar1 = UnknownFieldSet::ParseFromString
                            ((UnknownFieldSet *)((long)&printed.field_2 + 8),data), bVar1)) {
        if ((this->single_line_mode_ & 1U) == 0) {
          TextGenerator::Print(generator," {\n");
          TextGenerator::Indent(generator);
        }
        else {
          TextGenerator::Print(generator," { ");
        }
        PrintUnknownFields(this,(UnknownFieldSet *)((long)&printed.field_2 + 8),generator);
        if ((this->single_line_mode_ & 1U) == 0) {
          TextGenerator::Outdent(generator);
          TextGenerator::Print(generator,"}\n");
        }
        else {
          TextGenerator::Print(generator,"} ");
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_170,": \"",&local_171);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        StringPiece::StringPiece<std::allocator<char>>(&local_188,data);
        src.length_ = (stringpiece_ssize_type)local_170;
        src.ptr_ = (char *)local_188.length_;
        CEscapeAndAppend((protobuf *)local_188.ptr_,src,(string *)dest);
        std::__cxx11::string::append(local_170);
        TextGenerator::Print(generator,(string *)local_170);
        std::__cxx11::string::~string((string *)local_170);
      }
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)((long)&printed.field_2 + 8));
      break;
    case TYPE_GROUP:
      TextGenerator::Print(generator,(string *)local_50);
      if ((this->single_line_mode_ & 1U) == 0) {
        TextGenerator::Print(generator," {\n");
        TextGenerator::Indent(generator);
      }
      else {
        TextGenerator::Print(generator," { ");
      }
      unknown_fields_00 = UnknownField::group((UnknownField *)field_number.field_2._8_8_);
      PrintUnknownFields(this,unknown_fields_00,generator);
      if ((this->single_line_mode_ & 1U) == 0) {
        TextGenerator::Outdent(generator);
        TextGenerator::Print(generator,"}\n");
      }
      else {
        TextGenerator::Print(generator,"} ");
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator& generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    string field_number = SimpleItoa(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator.Print(field_number);
        generator.Print(": ");
        generator.Print(SimpleItoa(field.varint()));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator.Print(field_number);
        const string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator.Print(" { ");
          } else {
            generator.Print(" {\n");
            generator.Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator.Print("} ");
          } else {
            generator.Outdent();
            generator.Print("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          string printed(": \"");
          CEscapeAndAppend(value, &printed);
          printed.append(single_line_mode_ ? "\" " : "\"\n");
          generator.Print(printed);
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator.Print(field_number);
        if (single_line_mode_) {
          generator.Print(" { ");
        } else {
          generator.Print(" {\n");
          generator.Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator.Print("} ");
        } else {
          generator.Outdent();
          generator.Print("}\n");
        }
        break;
    }
  }
}